

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *p,Ivy_Obj_t *pNode,Vec_Ptr_t *vSuper)

{
  int iVar1;
  int iVar2;
  int iVar3;
  lit lVar4;
  lit *begin;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pIVar6;
  int local_3c;
  int i;
  int RetValue;
  int nLits;
  int *pLits;
  Ivy_Obj_t *pFanin;
  Vec_Ptr_t *vSuper_local;
  Ivy_Obj_t *pNode_local;
  Ivy_FraigMan_t *p_local;
  
  iVar1 = Ivy_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x987,"void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)"
                 );
  }
  iVar1 = Ivy_ObjIsNode(pNode);
  if (iVar1 == 0) {
    __assert_fail("Ivy_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x988,"void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)"
                 );
  }
  iVar1 = Vec_PtrSize(vSuper);
  begin = (lit *)malloc((long)(iVar1 + 1) << 2);
  for (local_3c = 0; iVar2 = Vec_PtrSize(vSuper), local_3c < iVar2; local_3c = local_3c + 1) {
    pIVar5 = (Ivy_Obj_t *)Vec_PtrEntry(vSuper,local_3c);
    pIVar6 = Ivy_Regular(pIVar5);
    iVar2 = Ivy_ObjSatNum(pIVar6);
    iVar3 = Ivy_IsComplement(pIVar5);
    lVar4 = toLitCond(iVar2,iVar3);
    *begin = lVar4;
    iVar2 = Ivy_ObjSatNum(pNode);
    lVar4 = toLitCond(iVar2,1);
    begin[1] = lVar4;
    iVar2 = sat_solver_addclause(p->pSat,begin,begin + 2);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0x993,
                    "void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
    }
  }
  for (local_3c = 0; iVar2 = Vec_PtrSize(vSuper), local_3c < iVar2; local_3c = local_3c + 1) {
    pIVar5 = (Ivy_Obj_t *)Vec_PtrEntry(vSuper,local_3c);
    pIVar6 = Ivy_Regular(pIVar5);
    iVar2 = Ivy_ObjSatNum(pIVar6);
    iVar3 = Ivy_IsComplement(pIVar5);
    lVar4 = toLitCond(iVar2,(uint)((iVar3 != 0 ^ 0xffU) & 1));
    begin[local_3c] = lVar4;
  }
  iVar2 = Ivy_ObjSatNum(pNode);
  lVar4 = toLitCond(iVar2,0);
  begin[iVar1] = lVar4;
  iVar1 = sat_solver_addclause(p->pSat,begin,begin + (iVar1 + 1));
  if (iVar1 != 0) {
    if (begin != (lit *)0x0) {
      free(begin);
    }
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0x99a,"void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Ivy_FraigAddClausesSuper( Ivy_FraigMan_t * p, Ivy_Obj_t * pNode, Vec_Ptr_t * vSuper )
{
    Ivy_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Ivy_IsComplement(pNode) );
    assert( Ivy_ObjIsNode( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Ivy_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = toLitCond(Ivy_ObjSatNum(Ivy_Regular(pFanin)), Ivy_IsComplement(pFanin));
        pLits[1] = toLitCond(Ivy_ObjSatNum(pNode), 1);
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Ivy_Obj_t *, vSuper, pFanin, i )
        pLits[i] = toLitCond(Ivy_ObjSatNum(Ivy_Regular(pFanin)), !Ivy_IsComplement(pFanin));
    pLits[nLits-1] = toLitCond(Ivy_ObjSatNum(pNode), 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}